

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O0

SPxId __thiscall
soplex::SPxSteepPR<double>::selectEnterHyperCoDim(SPxSteepPR<double> *this,double *best,double tol)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  double *pdVar4;
  double *pdVar5;
  char *pcVar6;
  int *piVar7;
  int n;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  int extraout_EDX_05;
  int extraout_EDX_06;
  double *in_RSI;
  long in_RDI;
  double in_XMM0_Qa;
  int i_1;
  int i;
  int idx;
  int enterIdx;
  double x;
  double leastBest;
  double *weights_ptr;
  double *test;
  int local_44;
  SPxSolverBase<double> *in_stack_ffffffffffffffc0;
  SPxSolverBase<double> *this_00;
  DataKey local_8;
  
  SPxSolverBase<double>::test(*(SPxSolverBase<double> **)(in_RDI + 0x10));
  pdVar4 = VectorBase<double>::get_const_ptr((VectorBase<double> *)0x2e7e2e);
  pdVar5 = VectorBase<double>::get_const_ptr((VectorBase<double> *)0x2e7e4a);
  this_00 = (SPxSolverBase<double> *)0xbff0000000000000;
  local_44 = -1;
  uVar1 = IdxSet::size((IdxSet *)(in_RDI + 0x128));
  iVar2 = extraout_EDX;
  while (uVar1 = uVar1 - 1, -1 < (int)uVar1) {
    pcVar6 = IdxSet::index((IdxSet *)(in_RDI + 0x128),(char *)(ulong)uVar1,iVar2);
    iVar2 = (int)pcVar6;
    in_stack_ffffffffffffffc0 = (SPxSolverBase<double> *)pdVar4[iVar2];
    if (-in_XMM0_Qa <= (double)in_stack_ffffffffffffffc0) {
      IdxSet::remove((IdxSet *)(in_RDI + 0x128),(char *)(ulong)uVar1);
      piVar7 = DataArray<int>::operator[]
                         ((DataArray<int> *)(*(long *)(in_RDI + 0x10) + 0x880),iVar2);
      *piVar7 = 0;
      iVar2 = extraout_EDX_01;
    }
    else {
      in_stack_ffffffffffffffc0 =
           (SPxSolverBase<double> *)
           steeppr::computePrice<double>((double)in_stack_ffffffffffffffc0,pdVar5[iVar2],in_XMM0_Qa)
      ;
      if (*in_RSI <= (double)in_stack_ffffffffffffffc0 &&
          (double)in_stack_ffffffffffffffc0 != *in_RSI) {
        *in_RSI = (double)in_stack_ffffffffffffffc0;
        local_44 = iVar2;
      }
      iVar2 = extraout_EDX_00;
      if (((double)in_stack_ffffffffffffffc0 < (double)this_00) || ((double)this_00 < 0.0)) {
        this_00 = in_stack_ffffffffffffffc0;
      }
    }
  }
  uVar3 = IdxSet::size((IdxSet *)(*(long *)(in_RDI + 0x10) + 0x848));
  iVar2 = extraout_EDX_02;
  while (uVar3 = uVar3 - 1, -1 < (int)uVar3) {
    pcVar6 = IdxSet::index((IdxSet *)(*(long *)(in_RDI + 0x10) + 0x848),(char *)(ulong)uVar3,iVar2);
    n = (int)pcVar6;
    piVar7 = DataArray<int>::operator[]((DataArray<int> *)(*(long *)(in_RDI + 0x10) + 0x880),n);
    iVar2 = extraout_EDX_03;
    if (*piVar7 == 1) {
      in_stack_ffffffffffffffc0 = (SPxSolverBase<double> *)pdVar4[n];
      if (-in_XMM0_Qa <= (double)in_stack_ffffffffffffffc0) {
        piVar7 = DataArray<int>::operator[]((DataArray<int> *)(*(long *)(in_RDI + 0x10) + 0x880),n);
        *piVar7 = 0;
        iVar2 = extraout_EDX_06;
      }
      else {
        in_stack_ffffffffffffffc0 =
             (SPxSolverBase<double> *)
             steeppr::computePrice<double>((double)in_stack_ffffffffffffffc0,pdVar5[n],in_XMM0_Qa);
        iVar2 = extraout_EDX_04;
        if ((double)this_00 < (double)in_stack_ffffffffffffffc0) {
          if (*in_RSI <= (double)in_stack_ffffffffffffffc0 &&
              (double)in_stack_ffffffffffffffc0 != *in_RSI) {
            *in_RSI = (double)in_stack_ffffffffffffffc0;
            local_44 = n;
          }
          piVar7 = DataArray<int>::operator[]
                             ((DataArray<int> *)(*(long *)(in_RDI + 0x10) + 0x880),n);
          *piVar7 = 2;
          DIdxSet::addIdx((DIdxSet *)CONCAT44(uVar1,uVar3),(int)((ulong)in_RDI >> 0x20));
          iVar2 = extraout_EDX_05;
        }
      }
    }
  }
  if (local_44 < 0) {
    SPxId::SPxId((SPxId *)0x2e812c);
  }
  else {
    local_8 = (DataKey)SPxSolverBase<double>::id
                                 (this_00,(int)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
  }
  return (SPxId)local_8;
}

Assistant:

SPxId SPxSteepPR<R>::selectEnterHyperCoDim(R& best, R tol)
{
   const R* test        = this->thesolver->test().get_const_ptr();
   const R* weights_ptr = this->thesolver->weights.get_const_ptr();

   R leastBest = -1;
   R x;
   int enterIdx = -1;
   int idx;

   // find the best price from short candidate list
   for(int i = bestPricesCo.size() - 1; i >= 0; --i)
   {
      idx = bestPricesCo.index(i);
      x = test[idx];

      if(x < -tol)
      {
         x = steeppr::computePrice(x, weights_ptr[idx], tol);

         assert(x >= 0);

         // update the best price of candidate list
         if(x > best)
         {
            best = x;
            enterIdx = idx;
         }

         // update the smallest price of candidate list
         if(x < leastBest || leastBest < 0)
            leastBest = x;
      }
      else
      {
         bestPricesCo.remove(i);
         this->thesolver->isInfeasibleCo[idx] = this->NOT_VIOLATED;
      }
   }

   // scan the updated indices for a better price
   for(int i = this->thesolver->updateViolsCo.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->updateViolsCo.index(i);

      // only look at indices that were not checked already
      if(this->thesolver->isInfeasibleCo[idx] == this->VIOLATED)
      {
         x = test[idx];

         if(x < -tol)
         {
            x = steeppr::computePrice(x, weights_ptr[idx], tol);

            if(x > leastBest)
            {
               if(x > best)
               {
                  best = x;
                  enterIdx = idx;
               }

               // put index into candidate list
               this->thesolver->isInfeasibleCo[idx] = this->VIOLATED_AND_CHECKED;
               bestPricesCo.addIdx(idx);
            }
         }
         else
         {
            this->thesolver->isInfeasibleCo[idx] = this->NOT_VIOLATED;
         }
      }
   }

   if(enterIdx >= 0)
      return this->thesolver->id(enterIdx);
   else
      return SPxId();
}